

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall ncnn::Dequantize::forward_inplace(Dequantize *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  int i;
  void *pvVar5;
  ulong uVar6;
  int j_1;
  ulong uVar7;
  ulong uVar8;
  int j;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  Mat local_70;
  
  iVar11 = bottom_top_blob->dims;
  if (iVar11 == 3) {
    uVar2 = bottom_top_blob->c;
    uVar10 = bottom_top_blob->h * bottom_top_blob->w;
    if (this->bias_term == 0) {
      uVar6 = 0;
      uVar7 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar7 = uVar6;
      }
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = uVar6;
      }
      while (iVar11 = (int)uVar6, iVar11 != (int)uVar8) {
        Mat::channel(&local_70,bottom_top_blob,iVar11);
        pvVar5 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,bottom_top_blob,iVar11);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar3 + uVar6 * 4) =
               (float)*(int *)((long)pvVar5 + uVar6 * 4) * this->scale;
        }
        uVar6 = (ulong)(iVar11 + 1);
      }
    }
    else {
      uVar6 = 0;
      uVar7 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar7 = uVar6;
      }
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = uVar6;
      }
      while (iVar11 = (int)uVar6, iVar11 != (int)uVar8) {
        Mat::channel(&local_70,bottom_top_blob,iVar11);
        pvVar5 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,bottom_top_blob,iVar11);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        uVar9 = 0;
        if (1 < this->bias_data_size) {
          uVar9 = uVar6;
        }
        fVar1 = *(float *)((long)(this->bias_data).data + uVar9 * 4);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar3 + uVar6 * 4) =
               (float)*(int *)((long)pvVar5 + uVar6 * 4) * this->scale + fVar1;
        }
        uVar6 = (ulong)(iVar11 + 1);
      }
    }
  }
  else if (iVar11 == 2) {
    uVar2 = bottom_top_blob->w;
    uVar10 = bottom_top_blob->h;
    pvVar5 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    if (this->bias_term == 0) {
      uVar7 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      uVar8 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar5 + uVar9 * 4) =
               (float)*(int *)((long)pvVar5 + uVar9 * 4) * this->scale;
        }
        pvVar5 = (void *)((long)pvVar5 + sVar4 * (long)(int)uVar2);
      }
    }
    else {
      iVar11 = this->bias_data_size;
      uVar7 = 0;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      uVar6 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar6 = 0;
      }
      for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
        uVar9 = uVar8 & 0xffffffff;
        if (iVar11 < 2) {
          uVar9 = 0;
        }
        fVar1 = *(float *)((long)(this->bias_data).data + uVar9 * 4);
        for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar5 + uVar9 * 4) =
               (float)*(int *)((long)pvVar5 + uVar9 * 4) * this->scale + fVar1;
        }
        pvVar5 = (void *)((long)pvVar5 + sVar4 * (long)(int)uVar2);
      }
    }
  }
  else if (iVar11 == 1) {
    uVar2 = bottom_top_blob->w;
    pvVar5 = bottom_top_blob->data;
    if (this->bias_term == 0) {
      uVar6 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar5 + uVar6 * 4) =
             (float)*(int *)((long)pvVar5 + uVar6 * 4) * this->scale;
      }
    }
    else if (this->bias_data_size < 2) {
      fVar1 = *(this->bias_data).data;
      uVar6 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar5 + uVar6 * 4) =
             (float)*(int *)((long)pvVar5 + uVar6 * 4) * this->scale + fVar1;
      }
    }
    else {
      pvVar3 = (this->bias_data).data;
      uVar6 = 0;
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar5 + uVar6 * 4) =
             (float)*(int *)((long)pvVar5 + uVar6 * 4) * this->scale +
             *(float *)((long)pvVar3 + uVar6 * 4);
      }
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        const int* intptr = bottom_top_blob;
        float* ptr = bottom_top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
            else
            {
                float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = intptr[i] * scale;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
    }

    return 0;
}